

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O0

Bac_Man_t * Bac_PtrTransformToCba(Vec_Ptr_t *vDes)

{
  Abc_Nam_t *p;
  int iVar1;
  int nIns;
  int nOuts;
  int nObjs;
  char *pcVar2;
  Vec_Int_t *vMap_00;
  Vec_Int_t *vBox2Id_00;
  Bac_Ntk_t *pBVar3;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *pVVar4;
  Vec_Ptr_t *vNtk_1;
  int NameId;
  Vec_Ptr_t *vOutputs;
  Vec_Ptr_t *vInputs;
  Vec_Ptr_t *vNtk;
  int i;
  Bac_Ntk_t *pNtk;
  Vec_Int_t *vBox2Id;
  Vec_Int_t *vMap;
  Bac_Man_t *pNew;
  char *pName;
  Vec_Ptr_t *vDes_local;
  
  pcVar2 = (char *)Vec_PtrEntry(vDes,0);
  iVar1 = Vec_PtrSize(vDes);
  vMap = (Vec_Int_t *)Bac_ManAlloc(pcVar2,iVar1 + -1);
  vMap_00 = Vec_IntStartFull(1000);
  vBox2Id_00 = Vec_IntAlloc(1000);
  for (vNtk._4_4_ = 1; iVar1 = Bac_ManNtkNum((Bac_Man_t *)vMap), vNtk._4_4_ <= iVar1;
      vNtk._4_4_ = vNtk._4_4_ + 1) {
    pBVar3 = Bac_ManNtk((Bac_Man_t *)vMap,vNtk._4_4_);
    pVVar4 = (Vec_Ptr_t *)Vec_PtrEntry(vDes,vNtk._4_4_);
    p_00 = (Vec_Ptr_t *)Vec_PtrEntry(pVVar4,1);
    p_01 = (Vec_Ptr_t *)Vec_PtrEntry(pVVar4,2);
    p = ((Bac_Man_t *)vMap)->pStrs;
    pcVar2 = (char *)Vec_PtrEntry(pVVar4,0);
    iVar1 = Abc_NamStrFindOrAdd(p,pcVar2,(int *)0x0);
    nIns = Vec_PtrSize(p_00);
    nOuts = Vec_PtrSize(p_01);
    nObjs = Ptr_ManCountNtk(pVVar4);
    Bac_NtkAlloc(pBVar3,iVar1,nIns,nOuts,nObjs);
    Bac_NtkStartNames(pBVar3);
  }
  for (vNtk._4_4_ = 1; iVar1 = Bac_ManNtkNum((Bac_Man_t *)vMap), vNtk._4_4_ <= iVar1;
      vNtk._4_4_ = vNtk._4_4_ + 1) {
    pBVar3 = Bac_ManNtk((Bac_Man_t *)vMap,vNtk._4_4_);
    pVVar4 = (Vec_Ptr_t *)Vec_PtrEntry(vDes,vNtk._4_4_);
    iVar1 = Bac_NtkDeriveFromPtr(pBVar3,pVVar4,vMap_00,vBox2Id_00);
    if (iVar1 == 0) break;
  }
  iVar1 = Bac_ManNtkNum((Bac_Man_t *)vMap);
  if (vNtk._4_4_ <= iVar1) {
    Bac_ManFree((Bac_Man_t *)vMap);
    vMap = (Vec_Int_t *)0x0;
  }
  Vec_IntFree(vBox2Id_00);
  Vec_IntFree(vMap_00);
  return (Bac_Man_t *)vMap;
}

Assistant:

Bac_Man_t * Bac_PtrTransformToCba( Vec_Ptr_t * vDes )
{
    char * pName = (char *)Vec_PtrEntry(vDes, 0);
    Bac_Man_t * pNew = Bac_ManAlloc( pName, Vec_PtrSize(vDes) - 1 );
    Vec_Int_t * vMap = Vec_IntStartFull( 1000 );
    Vec_Int_t * vBox2Id = Vec_IntAlloc( 1000 );
    // create interfaces
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( pNew, pNtk, i )
    {
        Vec_Ptr_t * vNtk = (Vec_Ptr_t *)Vec_PtrEntry(vDes, i);
        Vec_Ptr_t * vInputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1);
        Vec_Ptr_t * vOutputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2);
        int NameId = Abc_NamStrFindOrAdd( pNew->pStrs, (char *)Vec_PtrEntry(vNtk, 0), NULL );
        Bac_NtkAlloc( pNtk, NameId, Vec_PtrSize(vInputs), Vec_PtrSize(vOutputs), Ptr_ManCountNtk(vNtk) );
        Bac_NtkStartNames( pNtk );
    }
    // parse the networks
    Bac_ManForEachNtk( pNew, pNtk, i )
    {
        Vec_Ptr_t * vNtk = (Vec_Ptr_t *)Vec_PtrEntry(vDes, i);
        if ( !Bac_NtkDeriveFromPtr( pNtk, vNtk, vMap, vBox2Id ) )
            break;
    }
    if ( i <= Bac_ManNtkNum(pNew) )
       Bac_ManFree(pNew), pNew = NULL;
    Vec_IntFree( vBox2Id );
    Vec_IntFree( vMap );
    return pNew;
}